

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrink-explosion-protection.cpp
# Opt level: O2

void checkShrinkExplosions_PairIntegral<long>(void)

{
  pointer plVar1;
  pointer plVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  pointer plVar6;
  pointer plVar7;
  initializer_list<long> __l;
  allocator_type local_89;
  vector<long,_std::allocator<long>_> fixtures;
  long local_70 [9];
  
  plVar4 = &DAT_00215208;
  plVar5 = local_70;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar5 = *plVar4;
    plVar4 = plVar4 + 1;
    plVar5 = plVar5 + 1;
  }
  __l._M_len = 9;
  __l._M_array = local_70;
  std::vector<long,_std::allocator<long>_>::vector(&fixtures,__l,&local_89);
  plVar1 = fixtures.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (plVar7 = fixtures.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar2 = fixtures.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish, plVar7 != plVar1; plVar7 = plVar7 + 1) {
    lVar3 = *plVar7;
    for (plVar6 = fixtures.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start; plVar6 != plVar2; plVar6 = plVar6 + 1) {
      checkShrinkExplosions<std::pair<long,long>,checkShrinkExplosions_PairIntegral<long>()::_lambda(std::pair<long,long>)_1_,1000,1000>
                (lVar3,*plVar6);
    }
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&fixtures.super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

void checkShrinkExplosions_PairIntegral() {
  std::vector<IntegralType> fixtures = {
      IntegralType(1),
      IntegralType(-1),
      IntegralType(3),
      IntegralType(-3),
      IntegralType(100),
      IntegralType(5555),
      IntegralType(-5555),
      std::numeric_limits<IntegralType>::min(),
      std::numeric_limits<IntegralType>::max()};
  for (IntegralType a : fixtures) {
    for (IntegralType b : fixtures) {
      checkShrinkExplosions<std::pair<IntegralType, IntegralType>>(
          std::make_pair(a, b), [](std::pair<IntegralType, IntegralType> x) {
            return Arbitrary<std::pair<IntegralType, IntegralType>>::shrink(x);
          });
    }
  }
}